

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O2

int Dar_ManRefactorTryCuts(Ref_Man_t *p,Aig_Obj_t *pObj,int nNodesSaved,int Required)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  Vec_Ptr_t *vLeaves;
  uint *puTruth;
  ulong uVar4;
  Kit_Graph_t *pKVar5;
  ulong uVar6;
  Kit_Graph_t *pKVar7;
  int iVar8;
  
  p->GainBest = -1;
  p->pGraphBest = (Kit_Graph_t *)0x0;
  iVar8 = 0;
  do {
    if (p->vCuts->nSize <= iVar8) {
LAB_00425cc0:
      return p->GainBest;
    }
    vLeaves = Vec_VecEntry(p->vCuts,iVar8);
    if (vLeaves->nSize != 0) {
      p->nCutsTried = p->nCutsTried + 1;
      Aig_ObjCollectCut(pObj,vLeaves,p->vCutNodes);
      puTruth = Aig_ManCutTruth(pObj,vLeaves,p->vCutNodes,p->vTruthElem,p->vTruthStore);
      iVar3 = vLeaves->nSize;
      uVar1 = 1 << ((char)iVar3 - 5U & 0x1f);
      if (iVar3 < 6) {
        uVar1 = 1;
      }
      uVar4 = (ulong)uVar1;
      uVar6 = uVar4;
      do {
        if ((int)uVar6 < 1) {
          iVar8 = Aig_NodeMffcSupp(p->pAig,pObj,0,(Vec_Ptr_t *)0x0);
          p->GainBest = iVar8;
          pKVar5 = Kit_GraphCreateConst0();
          goto LAB_00425cb0;
        }
        lVar2 = uVar6 - 1;
        uVar6 = uVar6 - 1;
      } while (puTruth[lVar2] == 0);
      do {
        if ((int)uVar4 < 1) {
          iVar8 = Aig_NodeMffcSupp(p->pAig,pObj,0,(Vec_Ptr_t *)0x0);
          p->GainBest = iVar8;
          pKVar5 = Kit_GraphCreateConst1();
LAB_00425cb0:
          p->pGraphBest = pKVar5;
          Vec_PtrCopy(p->vLeavesBest,vLeaves);
          goto LAB_00425cc0;
        }
        lVar2 = uVar4 - 1;
        uVar4 = uVar4 - 1;
      } while (puTruth[lVar2] == 0xffffffff);
      iVar3 = Kit_TruthIsop(puTruth,iVar3,p->vMemory,0);
      if (-1 < iVar3) {
        pKVar5 = Kit_SopFactor(p->vMemory,0,vLeaves->nSize,p->vMemory);
        iVar3 = Dar_RefactTryGraph(p->pAig,pObj,vLeaves,pKVar5,
                                   nNodesSaved - (uint)(p->pPars->fUseZeros == 0),Required);
        if (iVar3 < 0) {
          Kit_GraphFree(pKVar5);
        }
        else {
          iVar3 = nNodesSaved - iVar3;
          if (p->GainBest < iVar3) {
            pKVar7 = p->pGraphBest;
LAB_00425af1:
            p->GainBest = iVar3;
            if (pKVar7 != (Kit_Graph_t *)0x0) {
LAB_00425af9:
              Kit_GraphFree(pKVar7);
            }
            p->pGraphBest = pKVar5;
            Vec_PtrCopy(p->vLeavesBest,vLeaves);
          }
          else {
            if (p->GainBest == iVar3) {
              pKVar7 = p->pGraphBest;
              if (pKVar5->fConst != 0) goto LAB_00425af1;
              if ((*(uint *)&pKVar7->pNodes[(uint)pKVar7->eRoot >> 1 & 0x3fffffff].field_0x10 &
                  0x3fff) <=
                  (*(uint *)&pKVar5->pNodes[(uint)pKVar5->eRoot >> 1 & 0x3fffffff].field_0x10 &
                  0x3fff)) goto LAB_00425b56;
              p->GainBest = iVar3;
              goto LAB_00425af9;
            }
LAB_00425b56:
            Kit_GraphFree(pKVar5);
          }
        }
      }
      uVar6 = (ulong)(uint)(1 << ((char)vLeaves->nSize - 5U & 0x1f));
      if (vLeaves->nSize < 6) {
        uVar6 = 1;
      }
      for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
        puTruth[uVar6 - 1] = ~puTruth[uVar6 - 1];
      }
      iVar3 = Kit_TruthIsop(puTruth,vLeaves->nSize,p->vMemory,0);
      if (-1 < iVar3) {
        pKVar5 = Kit_SopFactor(p->vMemory,1,vLeaves->nSize,p->vMemory);
        iVar3 = Dar_RefactTryGraph(p->pAig,pObj,vLeaves,pKVar5,
                                   nNodesSaved - (uint)(p->pPars->fUseZeros == 0),Required);
        if (iVar3 < 0) {
          Kit_GraphFree(pKVar5);
        }
        else {
          iVar3 = nNodesSaved - iVar3;
          if (p->GainBest < iVar3) {
            pKVar7 = p->pGraphBest;
LAB_00425c08:
            p->GainBest = iVar3;
            if (pKVar7 != (Kit_Graph_t *)0x0) {
LAB_00425c10:
              Kit_GraphFree(pKVar7);
            }
            p->pGraphBest = pKVar5;
            Vec_PtrCopy(p->vLeavesBest,vLeaves);
          }
          else {
            if (p->GainBest == iVar3) {
              pKVar7 = p->pGraphBest;
              if (pKVar5->fConst != 0) goto LAB_00425c08;
              if ((*(uint *)&pKVar7->pNodes[(uint)pKVar7->eRoot >> 1 & 0x3fffffff].field_0x10 &
                  0x3fff) <=
                  (*(uint *)&pKVar5->pNodes[(uint)pKVar5->eRoot >> 1 & 0x3fffffff].field_0x10 &
                  0x3fff)) goto LAB_00425c6a;
              p->GainBest = iVar3;
              goto LAB_00425c10;
            }
LAB_00425c6a:
            Kit_GraphFree(pKVar5);
          }
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int Dar_ManRefactorTryCuts( Ref_Man_t * p, Aig_Obj_t * pObj, int nNodesSaved, int Required )
{
    Vec_Ptr_t * vCut;
    Kit_Graph_t * pGraphCur;
    int k, RetValue, GainCur, nNodesAdded;
    unsigned * pTruth;

    p->GainBest = -1;
    p->pGraphBest = NULL;
    Vec_VecForEachLevel( p->vCuts, vCut, k )
    {
        if ( Vec_PtrSize(vCut) == 0 )
            continue;
//        if ( Vec_PtrSize(vCut) != 0 && Vec_PtrSize(Vec_VecEntry(p->vCuts, k+1)) != 0 )
//            continue;

        p->nCutsTried++;
        // get the cut nodes
        Aig_ObjCollectCut( pObj, vCut, p->vCutNodes );
        // get the truth table
        pTruth = Aig_ManCutTruth( pObj, vCut, p->vCutNodes, p->vTruthElem, p->vTruthStore );
        if ( Kit_TruthIsConst0(pTruth, Vec_PtrSize(vCut)) )
        {
            p->GainBest = Aig_NodeMffcSupp( p->pAig, pObj, 0, NULL );
            p->pGraphBest = Kit_GraphCreateConst0();
            Vec_PtrCopy( p->vLeavesBest, vCut );
            return p->GainBest;
        }
        if ( Kit_TruthIsConst1(pTruth, Vec_PtrSize(vCut)) )
        {
            p->GainBest = Aig_NodeMffcSupp( p->pAig, pObj, 0, NULL );
            p->pGraphBest = Kit_GraphCreateConst1();
            Vec_PtrCopy( p->vLeavesBest, vCut );
            return p->GainBest;
        }

        // try the positive phase
        RetValue = Kit_TruthIsop( pTruth, Vec_PtrSize(vCut), p->vMemory, 0 );
        if ( RetValue > -1 )
        {
            pGraphCur = Kit_SopFactor( p->vMemory, 0, Vec_PtrSize(vCut), p->vMemory );
/*
{
    int RetValue;
    RetValue = Bdc_ManDecompose( p->pManDec, pTruth, NULL, Vec_PtrSize(vCut), NULL, 1000 );
    printf( "Graph = %d. Bidec = %d.\n", Kit_GraphNodeNum(pGraphCur), RetValue );
}
*/
            nNodesAdded = Dar_RefactTryGraph( p->pAig, pObj, vCut, pGraphCur, nNodesSaved - !p->pPars->fUseZeros, Required );
            if ( nNodesAdded > -1 )
            {
                GainCur = nNodesSaved - nNodesAdded;
                if ( p->GainBest < GainCur || (p->GainBest == GainCur && 
                    (Kit_GraphIsConst(pGraphCur) || Kit_GraphRootLevel(pGraphCur) < Kit_GraphRootLevel(p->pGraphBest))) )
                {
                    p->GainBest = GainCur;
                    if ( p->pGraphBest )
                        Kit_GraphFree( p->pGraphBest );
                    p->pGraphBest = pGraphCur;
                    Vec_PtrCopy( p->vLeavesBest, vCut );
                }
                else
                    Kit_GraphFree( pGraphCur );
            }
            else
                Kit_GraphFree( pGraphCur );
        }
        // try negative phase
        Kit_TruthNot( pTruth, pTruth, Vec_PtrSize(vCut) );
        RetValue = Kit_TruthIsop( pTruth, Vec_PtrSize(vCut), p->vMemory, 0 );
//        Kit_TruthNot( pTruth, pTruth, Vec_PtrSize(vCut) );
        if ( RetValue > -1 )
        {
            pGraphCur = Kit_SopFactor( p->vMemory, 1, Vec_PtrSize(vCut), p->vMemory );
/*
{
    int RetValue;
    RetValue = Bdc_ManDecompose( p->pManDec, pTruth, NULL, Vec_PtrSize(vCut), NULL, 1000 );
    printf( "Graph = %d. Bidec = %d.\n", Kit_GraphNodeNum(pGraphCur), RetValue );
}
*/
            nNodesAdded = Dar_RefactTryGraph( p->pAig, pObj, vCut, pGraphCur, nNodesSaved - !p->pPars->fUseZeros, Required );
            if ( nNodesAdded > -1 )
            {
                GainCur = nNodesSaved - nNodesAdded;
                if ( p->GainBest < GainCur || (p->GainBest == GainCur && 
                    (Kit_GraphIsConst(pGraphCur) || Kit_GraphRootLevel(pGraphCur) < Kit_GraphRootLevel(p->pGraphBest))) )
                {
                    p->GainBest = GainCur;
                    if ( p->pGraphBest )
                        Kit_GraphFree( p->pGraphBest );
                    p->pGraphBest = pGraphCur;
                    Vec_PtrCopy( p->vLeavesBest, vCut );
                }
                else
                    Kit_GraphFree( pGraphCur );
            }
            else
                Kit_GraphFree( pGraphCur );
        }
    }

    return p->GainBest;
}